

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall
simple_json::Stream::
statement_no_return<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
          (Stream *this,char (*ts) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [2])

{
  size_t sVar1;
  uint uVar2;
  StringStream<4096UL,_4096UL> *this_00;
  
  if (this->indent != 0) {
    uVar2 = 0;
    do {
      spirv_cross::StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->indent);
  }
  this_00 = &this->buffer;
  sVar1 = strlen(*ts);
  spirv_cross::StringStream<4096UL,_4096UL>::append(this_00,*ts,sVar1);
  spirv_cross::StringStream<4096UL,_4096UL>::append
            (this_00,(ts_1->_M_dataplus)._M_p,ts_1->_M_string_length);
  sVar1 = strlen(*ts_2);
  spirv_cross::StringStream<4096UL,_4096UL>::append(this_00,*ts_2,sVar1);
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}